

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int session_update_stream_priority(nghttp2_session *session,nghttp2_stream *stream,uint8_t u8extpri)

{
  int iVar1;
  
  if (stream->extpri != u8extpri) {
    if (stream->queued != '\0') {
      session_ob_data_remove(session,stream);
      stream->extpri = u8extpri;
      iVar1 = session_ob_data_push(session,stream);
      return iVar1;
    }
    stream->extpri = u8extpri;
  }
  return 0;
}

Assistant:

static int session_update_stream_priority(nghttp2_session *session,
                                          nghttp2_stream *stream,
                                          uint8_t u8extpri) {
  if (stream->extpri == u8extpri) {
    return 0;
  }

  if (stream->queued) {
    session_ob_data_remove(session, stream);

    stream->extpri = u8extpri;

    return session_ob_data_push(session, stream);
  }

  stream->extpri = u8extpri;

  return 0;
}